

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O3

void surv0_ctx_cancel(nni_aio *aio,void *arg,int rv)

{
  nni_mtx *mtx;
  long lVar1;
  int iVar2;
  
  lVar1 = *arg;
  mtx = (nni_mtx *)(lVar1 + 0x20);
  nni_mtx_lock(mtx);
  iVar2 = nni_list_active((nni_list *)((long)arg + 0x58),aio);
  if (iVar2 != 0) {
    nni_list_remove((nni_list *)((long)arg + 0x58),aio);
    nni_aio_finish_error(aio,rv);
  }
  if ((ulong)*(uint *)((long)arg + 8) != 0) {
    nni_id_remove((nni_id_map *)(lVar1 + 0xd0),(ulong)*(uint *)((long)arg + 8));
    *(undefined4 *)((long)arg + 8) = 0;
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
surv0_ctx_cancel(nni_aio *aio, void *arg, int rv)
{
	surv0_ctx  *ctx  = arg;
	surv0_sock *sock = ctx->sock;
	nni_mtx_lock(&sock->mtx);
	if (nni_list_active(&ctx->recv_queue, aio)) {
		nni_list_remove(&ctx->recv_queue, aio);
		nni_aio_finish_error(aio, rv);
	}
	if (ctx->survey_id != 0) {
		nni_id_remove(&sock->surveys, ctx->survey_id);
		ctx->survey_id = 0;
	}
	nni_mtx_unlock(&sock->mtx);
}